

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall cmFindPackageCommand::AppendSearchPathGroups(cmFindPackageCommand *this)

{
  vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_> *pvVar1;
  mapped_type *this_00;
  __enable_if_t<is_constructible<value_type,_pair<PathLabel,_cmSearchPath>_>::value,_pair<iterator,_bool>_>
  _Var2;
  cmSearchPath local_1f8;
  pair<cmFindPackageCommand::PathLabel,_cmSearchPath> local_1d8;
  _Base_ptr local_190;
  undefined1 local_188;
  cmSearchPath local_180;
  pair<cmFindPackageCommand::PathLabel,_cmSearchPath> local_160;
  _Base_ptr local_118;
  undefined1 local_110;
  cmSearchPath local_f8;
  pair<cmFindPackageCommand::PathLabel,_cmSearchPath> local_d8;
  PathLabel *local_90;
  PathLabel *local_88;
  __normal_iterator<cmFindCommon::PathLabel_*,_std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>_>
  local_80;
  __normal_iterator<cmFindCommon::PathLabel_*,_std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>_>
  local_78;
  const_iterator local_70;
  PathLabel *local_68;
  PathLabel *local_60;
  __normal_iterator<cmFindCommon::PathLabel_*,_std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>_>
  local_58;
  __normal_iterator<cmFindCommon::PathLabel_*,_std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>_>
  local_50;
  const_iterator local_48;
  PathLabel *local_40;
  PathLabel *local_38;
  __normal_iterator<cmFindCommon::PathLabel_*,_std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>_>
  local_30;
  __normal_iterator<cmFindCommon::PathLabel_*,_std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>_>
  local_28;
  const_iterator local_20;
  vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_> *local_18;
  vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_> *labels;
  cmFindPackageCommand *this_local;
  
  labels = (vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_> *)this;
  this_00 = std::
            map<cmFindCommon::PathGroup,_std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>,_std::less<cmFindCommon::PathGroup>,_std::allocator<std::pair<const_cmFindCommon::PathGroup,_std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>_>_>_>
            ::operator[](&(this->super_cmFindCommon).PathGroupLabelMap,&cmFindCommon::PathGroup::All
                        );
  local_18 = this_00;
  local_30._M_current =
       (PathLabel *)
       std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>::begin
                 (this_00);
  local_38 = (PathLabel *)
             std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>::end
                       (local_18);
  local_28 = std::
             find<__gnu_cxx::__normal_iterator<cmFindCommon::PathLabel*,std::vector<cmFindCommon::PathLabel,std::allocator<cmFindCommon::PathLabel>>>,cmFindCommon::PathLabel>
                       (local_30,(__normal_iterator<cmFindCommon::PathLabel_*,_std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>_>
                                  )local_38,&cmFindCommon::PathLabel::CMakeSystem);
  __gnu_cxx::
  __normal_iterator<cmFindCommon::PathLabel_const*,std::vector<cmFindCommon::PathLabel,std::allocator<cmFindCommon::PathLabel>>>
  ::__normal_iterator<cmFindCommon::PathLabel*>
            ((__normal_iterator<cmFindCommon::PathLabel_const*,std::vector<cmFindCommon::PathLabel,std::allocator<cmFindCommon::PathLabel>>>
              *)&local_20,&local_28);
  local_40 = (PathLabel *)
             std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>::insert
                       (this_00,local_20,&PathLabel::UserRegistry.super_PathLabel);
  pvVar1 = local_18;
  local_58._M_current =
       (PathLabel *)
       std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>::begin
                 (local_18);
  local_60 = (PathLabel *)
             std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>::end
                       (local_18);
  local_50 = std::
             find<__gnu_cxx::__normal_iterator<cmFindCommon::PathLabel*,std::vector<cmFindCommon::PathLabel,std::allocator<cmFindCommon::PathLabel>>>,cmFindCommon::PathLabel>
                       (local_58,(__normal_iterator<cmFindCommon::PathLabel_*,_std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>_>
                                  )local_60,&cmFindCommon::PathLabel::CMakeSystem);
  __gnu_cxx::
  __normal_iterator<cmFindCommon::PathLabel_const*,std::vector<cmFindCommon::PathLabel,std::allocator<cmFindCommon::PathLabel>>>
  ::__normal_iterator<cmFindCommon::PathLabel*>
            ((__normal_iterator<cmFindCommon::PathLabel_const*,std::vector<cmFindCommon::PathLabel,std::allocator<cmFindCommon::PathLabel>>>
              *)&local_48,&local_50);
  local_68 = (PathLabel *)
             std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>::insert
                       (pvVar1,local_48,&PathLabel::Builds.super_PathLabel);
  pvVar1 = local_18;
  local_80._M_current =
       (PathLabel *)
       std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>::begin
                 (local_18);
  local_88 = (PathLabel *)
             std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>::end
                       (local_18);
  local_78 = std::
             find<__gnu_cxx::__normal_iterator<cmFindCommon::PathLabel*,std::vector<cmFindCommon::PathLabel,std::allocator<cmFindCommon::PathLabel>>>,cmFindCommon::PathLabel>
                       (local_80,(__normal_iterator<cmFindCommon::PathLabel_*,_std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>_>
                                  )local_88,&cmFindCommon::PathLabel::Guess);
  __gnu_cxx::
  __normal_iterator<cmFindCommon::PathLabel_const*,std::vector<cmFindCommon::PathLabel,std::allocator<cmFindCommon::PathLabel>>>
  ::__normal_iterator<cmFindCommon::PathLabel*>
            ((__normal_iterator<cmFindCommon::PathLabel_const*,std::vector<cmFindCommon::PathLabel,std::allocator<cmFindCommon::PathLabel>>>
              *)&local_70,&local_78);
  local_90 = (PathLabel *)
             std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>::insert
                       (pvVar1,local_70,&PathLabel::SystemRegistry.super_PathLabel);
  cmSearchPath::cmSearchPath(&local_f8,&this->super_cmFindCommon);
  std::make_pair<cmFindPackageCommand::PathLabel&,cmSearchPath>
            (&local_d8,&PathLabel::UserRegistry,&local_f8);
  _Var2 = std::
          map<cmFindCommon::PathLabel,cmSearchPath,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
          ::insert<std::pair<cmFindPackageCommand::PathLabel,cmSearchPath>>
                    ((map<cmFindCommon::PathLabel,cmSearchPath,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
                      *)&(this->super_cmFindCommon).LabeledPaths,&local_d8);
  local_118 = (_Base_ptr)_Var2.first._M_node;
  local_110 = _Var2.second;
  std::pair<cmFindPackageCommand::PathLabel,_cmSearchPath>::~pair(&local_d8);
  cmSearchPath::~cmSearchPath(&local_f8);
  cmSearchPath::cmSearchPath(&local_180,&this->super_cmFindCommon);
  std::make_pair<cmFindPackageCommand::PathLabel&,cmSearchPath>
            (&local_160,&PathLabel::Builds,&local_180);
  _Var2 = std::
          map<cmFindCommon::PathLabel,cmSearchPath,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
          ::insert<std::pair<cmFindPackageCommand::PathLabel,cmSearchPath>>
                    ((map<cmFindCommon::PathLabel,cmSearchPath,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
                      *)&(this->super_cmFindCommon).LabeledPaths,&local_160);
  local_190 = (_Base_ptr)_Var2.first._M_node;
  local_188 = _Var2.second;
  std::pair<cmFindPackageCommand::PathLabel,_cmSearchPath>::~pair(&local_160);
  cmSearchPath::~cmSearchPath(&local_180);
  cmSearchPath::cmSearchPath(&local_1f8,&this->super_cmFindCommon);
  std::make_pair<cmFindPackageCommand::PathLabel&,cmSearchPath>
            (&local_1d8,&PathLabel::SystemRegistry,&local_1f8);
  std::
  map<cmFindCommon::PathLabel,cmSearchPath,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
  ::insert<std::pair<cmFindPackageCommand::PathLabel,cmSearchPath>>
            ((map<cmFindCommon::PathLabel,cmSearchPath,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
              *)&(this->super_cmFindCommon).LabeledPaths,&local_1d8);
  std::pair<cmFindPackageCommand::PathLabel,_cmSearchPath>::~pair(&local_1d8);
  cmSearchPath::~cmSearchPath(&local_1f8);
  return;
}

Assistant:

void cmFindPackageCommand::AppendSearchPathGroups()
{
  std::vector<cmFindCommon::PathLabel>* labels;

  // Update the All group with new paths
  labels = &this->PathGroupLabelMap[PathGroup::All];
  labels->insert(std::find(labels->begin(), labels->end(),
                           PathLabel::CMakeSystem),
                 PathLabel::UserRegistry);
  labels->insert(std::find(labels->begin(), labels->end(),
                           PathLabel::CMakeSystem),
                 PathLabel::Builds);
  labels->insert(std::find(labels->begin(), labels->end(), PathLabel::Guess),
                 PathLabel::SystemRegistry);

  // Create the new path objects
  this->LabeledPaths.insert(std::make_pair(PathLabel::UserRegistry,
    cmSearchPath(this)));
  this->LabeledPaths.insert(std::make_pair(PathLabel::Builds,
    cmSearchPath(this)));
  this->LabeledPaths.insert(std::make_pair(PathLabel::SystemRegistry,
    cmSearchPath(this)));
}